

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O3

void Cmd_eval(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  FProduction *block;
  char *pcVar3;
  FBaseCVar *this;
  FProduction *pFVar4;
  ECVarType type;
  UCVarValue value;
  int parsept;
  int local_24;
  float local_20;
  undefined4 uStack_1c;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
LAB_0035cd8f:
    Printf("Usage: eval <expression> [variable]\n");
    return;
  }
  local_24 = 1;
  block = ParseExpression(argv,&local_24);
  iVar1 = local_24;
  if (block == (FProduction *)0x0) goto LAB_0035cd8f;
  iVar2 = FCommandLine::argc(argv);
  if (iVar1 < iVar2) {
    pcVar3 = FCommandLine::operator[](argv,local_24);
    this = FindCVar(pcVar3,(FBaseCVar **)0x0);
    if (this != (FBaseCVar *)0x0) {
      if (block->Type == PROD_Double) {
        local_20 = (float)*(double *)(block + 2);
        value._4_4_ = uStack_1c;
        value.Float = local_20;
        type = CVAR_Float;
      }
      else {
        value.String = (char *)(block + 1);
        type = CVAR_String;
      }
      FBaseCVar::SetGenericRep(this,value,type);
      goto LAB_0035cdfc;
    }
    pFVar4 = (FProduction *)FCommandLine::operator[](argv,local_24);
    pcVar3 = "Unknown variable %s\n";
  }
  else {
    if (block->Type == PROD_Double) {
      Printf("%g\n",*(undefined8 *)(block + 2));
      goto LAB_0035cdfc;
    }
    pFVar4 = block + 1;
    pcVar3 = "%s\n";
  }
  Printf(pcVar3,pFVar4);
LAB_0035cdfc:
  M_Free(block);
  return;
}

Assistant:

CCMD (eval)
{
	if (argv.argc() >= 2)
	{
		int parsept = 1;
		FProduction *prod = ParseExpression (argv, parsept);

		if (prod != NULL)
		{
			if (parsept < argv.argc())
			{
				FBaseCVar *var = FindCVar (argv[parsept], NULL);
				if (var == NULL)
				{
					Printf ("Unknown variable %s\n", argv[parsept]);
				}
				else
				{
					UCVarValue val;

					if (prod->Type == PROD_Double)
					{
						val.Float = (float)static_cast<FDoubleProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_Float);
					}
					else
					{
						val.String = static_cast<FStringProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_String);
					}
				}
			}
			else
			{
				if (prod->Type == PROD_Double)
				{
					Printf ("%g\n", static_cast<FDoubleProd *>(prod)->Value);
				}
				else
				{
					Printf ("%s\n", static_cast<FStringProd *>(prod)->Value);
				}
			}
			M_Free (prod);
			return;
		}
	}

	Printf ("Usage: eval <expression> [variable]\n");
}